

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Vector<float,_2> __thiscall tcu::operator*(tcu *this,Matrix<float,_2,_2> *mtx,Vector<float,_2> *vec)

{
  Vector<float,_2> VVar1;
  int row;
  long lVar2;
  Vector<float,_2> *res;
  long lVar3;
  float in_XMM0_Da;
  float v;
  float in_XMM0_Db;
  
  *(undefined8 *)this = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    in_XMM0_Da = 0.0;
    in_XMM0_Db = 0.0;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      in_XMM0_Da = in_XMM0_Da + *(float *)((long)mtx + lVar3 * 2 * 4) * vec->m_data[lVar3];
    }
    *(float *)(this + lVar2 * 4) = in_XMM0_Da;
    mtx = (Matrix<float,_2,_2> *)((long)mtx + 4);
  }
  VVar1.m_data[1] = in_XMM0_Db;
  VVar1.m_data[0] = in_XMM0_Da;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

Vector<T, Rows> operator* (const Matrix<T, Rows, Cols>& mtx, const Vector<T, Cols>& vec)
{
	Vector<T, Rows> res;
	for (int row = 0; row < Rows; row++)
	{
		T v = T(0);
		for (int col = 0; col < Cols; col++)
			v += mtx(row,col) * vec.m_data[col];
		res.m_data[row] = v;
	}
	return res;
}